

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_zTXt(ucvector *out,char *keyword,char *textstring,
                  LodePNGCompressSettings *zlibsettings)

{
  size_t insize;
  size_t size_00;
  size_t size;
  size_t keysize;
  size_t textsize;
  size_t compressedsize;
  uchar *compressed;
  uchar *chunk;
  LodePNGCompressSettings *pLStack_30;
  uint error;
  LodePNGCompressSettings *zlibsettings_local;
  char *textstring_local;
  char *keyword_local;
  ucvector *out_local;
  
  chunk._4_4_ = 0;
  compressed = (uchar *)0x0;
  compressedsize = 0;
  textsize = 0;
  pLStack_30 = zlibsettings;
  zlibsettings_local = (LodePNGCompressSettings *)textstring;
  textstring_local = keyword;
  keyword_local = (char *)out;
  insize = lodepng_strlen(textstring);
  size_00 = lodepng_strlen(textstring_local);
  if ((size_00 == 0) || (0x4f < size_00)) {
    out_local._4_4_ = 0x59;
  }
  else {
    chunk._4_4_ = zlib_compress((uchar **)&compressedsize,&textsize,(uchar *)zlibsettings_local,
                                insize,pLStack_30);
    if (chunk._4_4_ == 0) {
      chunk._4_4_ = lodepng_chunk_init(&compressed,(ucvector *)keyword_local,
                                       (int)size_00 + 2 + (int)textsize,"zTXt");
    }
    if (chunk._4_4_ == 0) {
      lodepng_memcpy(compressed + 8,textstring_local,size_00);
      compressed[size_00 + 8] = '\0';
      compressed[size_00 + 9] = '\0';
      lodepng_memcpy(compressed + size_00 + 10,(void *)compressedsize,textsize);
      lodepng_chunk_generate_crc(compressed);
    }
    lodepng_free((void *)compressedsize);
    out_local._4_4_ = chunk._4_4_;
  }
  return out_local._4_4_;
}

Assistant:

static unsigned addChunk_zTXt(ucvector* out, const char* keyword, const char* textstring,
                              LodePNGCompressSettings* zlibsettings) {
  unsigned error = 0;
  unsigned char* chunk = 0;
  unsigned char* compressed = 0;
  size_t compressedsize = 0;
  size_t textsize = lodepng_strlen(textstring);
  size_t keysize = lodepng_strlen(keyword);
  if(keysize < 1 || keysize > 79) return 89; /*error: invalid keyword size*/

  error = zlib_compress(&compressed, &compressedsize,
                        (const unsigned char*)textstring, textsize, zlibsettings);
  if(!error) {
    size_t size = keysize + 2 + compressedsize;
    error = lodepng_chunk_init(&chunk, out, size, "zTXt");
  }
  if(!error) {
    lodepng_memcpy(chunk + 8, keyword, keysize);
    chunk[8 + keysize] = 0; /*null termination char*/
    chunk[9 + keysize] = 0; /*compression method: 0*/
    lodepng_memcpy(chunk + 10 + keysize, compressed, compressedsize);
    lodepng_chunk_generate_crc(chunk);
  }

  lodepng_free(compressed);
  return error;
}